

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsSecondaryTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,ComputeInvocationsSecondaryTestInstance *this,
          VkCommandPool *cmdPool,VkPipelineLayout pipelineLayout,VkDescriptorSet *descriptorSet,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes)

{
  deInt32 *pdVar1;
  pointer pPVar2;
  Handle<(vk::HandleType)18> commandBuffer;
  SharedPtrStateBase *pSVar3;
  VkDevice pVVar4;
  VkResult VVar5;
  DeviceInterface *deviceInterface;
  VkQueue queue;
  Unique<vk::Handle<(vk::HandleType)14>_> *pUVar6;
  const_iterator cVar7;
  Unique<vk::Handle<(vk::HandleType)18>_> *pUVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
  *pvVar12;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> local_228;
  VkCommandBufferUsageFlags local_218;
  undefined4 uStack_214;
  VkCommandBufferInheritanceInfo *pVStack_210;
  Move<vk::Handle<(vk::HandleType)18>_> local_208;
  ComputeInvocationsSecondaryTestInstance *local_1e0;
  Buffer *local_1d8;
  SharedPtrStateBase *local_1d0;
  SharedPtr<vkt::Draw::Buffer> local_1c8;
  VkDevice local_1b8;
  TestStatus *local_1b0;
  SharedPtr<vkt::Draw::Buffer> *local_1a8;
  deUint64 local_1a0;
  VkQueryPool local_198;
  Deleter<vk::Handle<(vk::HandleType)11>_> DStack_190;
  VkCommandBufferBeginInfo info;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  shaderModule;
  undefined4 local_c0 [2];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  deUint64 local_a0;
  undefined8 local_98;
  VkDeviceSize local_90;
  undefined4 local_88 [2];
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  deUint64 local_68;
  undefined8 local_60;
  VkDeviceSize local_58;
  Move<vk::Handle<(vk::HandleType)11>_> local_50;
  
  local_1b0 = __return_storage_ptr__;
  local_1a0 = pipelineLayout.m_internal;
  deviceInterface =
       Context::getDeviceInterface
                 ((this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  local_1b8 = Context::getDevice((this->super_ComputeInvocationsTestInstance).
                                 super_StatisticQueryTestInstance.super_TestInstance.m_context);
  queue = Context::getUniversalQueue
                    ((this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.
                     super_TestInstance.m_context);
  local_88[0] = 0x2c;
  local_80 = 0;
  local_78 = 0x4000000040;
  uStack_70 = 0xffffffffffffffff;
  local_a0 = (buffer->m_ptr->m_object).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal;
  local_60 = 0;
  local_58 = bufferSizeBytes;
  local_c0[0] = 0x2c;
  local_b8 = 0;
  local_b0 = 0x200000000040;
  uStack_a8 = 0xffffffffffffffff;
  local_98 = 0;
  local_90 = bufferSizeBytes;
  shaderModule.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shaderModule.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shaderModule.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pipeline.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar12 = (this->super_ComputeInvocationsTestInstance).m_parameters;
  local_1e0 = this;
  local_1a8 = buffer;
  local_68 = local_a0;
  if ((pvVar12->
      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (pvVar12->
      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0x18;
    uVar11 = 0;
    do {
      pUVar6 = (Unique<vk::Handle<(vk::HandleType)14>_> *)operator_new(0x20);
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                      *)((local_1e0->super_ComputeInvocationsTestInstance).
                         super_StatisticQueryTestInstance.super_TestInstance.m_context)->
                        m_progCollection,
                     (key_type *)
                     ((long)(((pvVar12->
                              super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                              )._M_impl.super__Vector_impl_data._M_start)->localSize).m_data + lVar9
                     ));
      pVVar4 = local_1b8;
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&info,deviceInterface,local_1b8,
                 *(ProgramBinary **)(cVar7._M_node + 2),0);
      (pUVar6->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
           (VkDevice)info._16_8_;
      (pUVar6->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)info.pInheritanceInfo;
      (pUVar6->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = info._0_8_
      ;
      (pUVar6->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
           (DeviceInterface *)info.pNext;
      info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      info._4_4_ = 0;
      info.pNext = (void *)0x0;
      info.flags = 0;
      info._20_4_ = 0;
      info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
           (deUint64)pUVar6;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)operator_new(0x20);
      ((SharedPtrStateBase *)
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface)->
      strongRefCount = 0;
      ((SharedPtrStateBase *)
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface)->
      weakRefCount = 0;
      ((SharedPtrStateBase *)
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface)->
      _vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef2f0;
      ((SharedPtrStateBase *)
      ((long)local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface +
      0x10))->_vptr_SharedPtrStateBase = (_func_int **)pUVar6;
      ((SharedPtrStateBase *)
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface)->
      strongRefCount = 1;
      ((SharedPtrStateBase *)
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface)->
      weakRefCount = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
                  *)&shaderModule,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)&local_208);
      if ((SharedPtrStateBase *)
          local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface !=
          (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = (deInt32 *)
                 ((long)local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                        m_deviceIface + 8);
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
          (*(local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface)
            ->_vptr_DeviceInterface[2])();
        }
        LOCK();
        pdVar1 = (deInt32 *)
                 ((long)local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                        m_deviceIface + 0xc);
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if ((SharedPtrStateBase *)
              local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
              != (SharedPtrStateBase *)0x0) {
            (*(local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
              )->_vptr_DeviceInterface[1])();
          }
          local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
               (DeviceInterface *)0x0;
        }
      }
      if (info._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&info.pNext,
                   (VkShaderModule)info._0_8_);
      }
      info.sType = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
      info.pNext = (void *)0x0;
      info._16_8_ = info._16_8_ & 0xffffffff00000000;
      info.pInheritanceInfo =
           (VkCommandBufferInheritanceInfo *)CONCAT44(info.pInheritanceInfo._4_4_,0x12);
      pUVar8 = (Unique<vk::Handle<(vk::HandleType)18>_> *)operator_new(0x20);
      ::vk::createComputePipeline
                (&local_208,deviceInterface,pVVar4,(VkPipelineCache)0x0,
                 (VkComputePipelineCreateInfo *)&info,(VkAllocationCallbacks *)0x0);
      (pUVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_device =
           local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
      (pUVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_allocator =
           local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
      (pUVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
           local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
      (pUVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.deleter.m_deviceIface =
           local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      local_228.m_state = (SharedPtrStateBase *)0x0;
      local_228.m_ptr = pUVar8;
      local_228.m_state = (SharedPtrStateBase *)operator_new(0x20);
      (local_228.m_state)->strongRefCount = 0;
      (local_228.m_state)->weakRefCount = 0;
      (local_228.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef3f0;
      local_228.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar8;
      (local_228.m_state)->strongRefCount = 1;
      (local_228.m_state)->weakRefCount = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
                  *)&pipeline,&local_228);
      if (local_228.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_228.m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_228.m_ptr = (Unique<vk::Handle<(vk::HandleType)18>_> *)0x0;
          (*(local_228.m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_228.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if (local_228.m_state != (SharedPtrStateBase *)0x0) {
            (*(local_228.m_state)->_vptr_SharedPtrStateBase[1])();
          }
          local_228.m_state = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                   (VkPipeline)
                   local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
                  );
      }
      uVar11 = uVar11 + 1;
      pvVar12 = (local_1e0->super_ComputeInvocationsTestInstance).m_parameters;
      lVar9 = lVar9 + 0x38;
    } while (uVar11 < (ulong)(((long)(pvVar12->
                                     super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar12->
                                     super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  pVVar4 = local_1b8;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&info,deviceInterface,local_1b8,
             (VkCommandPool)cmdPool->m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)info._16_8_;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)info.pInheritanceInfo;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = info._0_8_;
  local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)info.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&info,deviceInterface,pVVar4,
             (VkCommandPool)cmdPool->m_internal,VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  local_218 = info.flags;
  uStack_214 = info._20_4_;
  pVStack_210 = info.pInheritanceInfo;
  local_228.m_ptr = (Unique<vk::Handle<(vk::HandleType)18>_> *)info._0_8_;
  local_228.m_state = (SharedPtrStateBase *)info.pNext;
  info.sType = VK_STRUCTURE_TYPE_QUERY_POOL_CREATE_INFO;
  info.pNext = (void *)0x0;
  info.flags = 0;
  info._20_4_ = 1;
  info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x40000000001;
  ::vk::createQueryPool
            (&local_50,deviceInterface,pVVar4,(VkQueryPoolCreateInfo *)&info,
             (VkAllocationCallbacks *)0x0);
  local_198.m_internal =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.object.m_internal;
  DStack_190.m_deviceIface =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_deviceIface;
  DStack_190.m_device =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_device;
  DStack_190.m_allocator =
       local_50.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator;
  local_1c8.m_ptr = local_1a8->m_ptr;
  local_1c8.m_state = local_1a8->m_state;
  if (local_1c8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_1c8.m_state)->strongRefCount = (local_1c8.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_1c8.m_state)->weakRefCount = (local_1c8.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  clearBuffer(deviceInterface,pVVar4,&local_1c8,bufferSizeBytes);
  pSVar3 = local_1c8.m_state;
  if (local_1c8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_1c8.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_1c8.m_ptr = (Buffer *)0x0;
      (*(local_1c8.m_state)->_vptr_SharedPtrStateBase[2])(local_1c8.m_state);
    }
    LOCK();
    pdVar1 = &pSVar3->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_1c8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_1c8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_1c8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  beginSecondaryCommandBuffer
            (deviceInterface,(VkCommandBuffer)local_228.m_ptr,0x400,(VkRenderPass)0x0,
             (VkFramebuffer)0x0,1);
  (*deviceInterface->_vptr_DeviceInterface[0x56])
            (deviceInterface,local_228.m_ptr,1,local_1a0,0,1,descriptorSet,0,0);
  (*deviceInterface->_vptr_DeviceInterface[0x70])
            (deviceInterface,local_228.m_ptr,local_198.m_internal,0,1);
  (*deviceInterface->_vptr_DeviceInterface[0x6e])
            (deviceInterface,local_228.m_ptr,local_198.m_internal,0,0);
  pvVar12 = (local_1e0->super_ComputeInvocationsTestInstance).m_parameters;
  if ((pvVar12->
      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (pvVar12->
      super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0x14;
    lVar10 = 0;
    uVar11 = 0;
    do {
      (*deviceInterface->_vptr_DeviceInterface[0x4c])
                (deviceInterface,local_228.m_ptr,1,
                 **(undefined8 **)
                   ((long)&(pipeline.
                            super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar10));
      pPVar2 = (((local_1e0->super_ComputeInvocationsTestInstance).m_parameters)->
               super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
               )._M_impl.super__Vector_impl_data._M_start;
      (*deviceInterface->_vptr_DeviceInterface[0x5d])
                (deviceInterface,local_228.m_ptr,
                 (ulong)*(uint *)((long)(pPVar2->localSize).m_data + lVar9 + -8),
                 (ulong)*(uint *)((long)(pPVar2->localSize).m_data + lVar9 + -4),
                 (ulong)*(uint *)((long)(pPVar2->localSize).m_data + lVar9));
      (*deviceInterface->_vptr_DeviceInterface[0x6d])
                (deviceInterface,local_228.m_ptr,0x800,0x800,0,0,0,1,local_88,0,0);
      uVar11 = uVar11 + 1;
      pvVar12 = (local_1e0->super_ComputeInvocationsTestInstance).m_parameters;
      lVar10 = lVar10 + 0x10;
      lVar9 = lVar9 + 0x38;
    } while (uVar11 < (ulong)(((long)(pvVar12->
                                     super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar12->
                                     super__Vector_base<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x6db6db6db6db6db7));
  }
  (*deviceInterface->_vptr_DeviceInterface[0x6f])
            (deviceInterface,local_228.m_ptr,local_198.m_internal,0);
  VVar5 = (*deviceInterface->_vptr_DeviceInterface[0x4a])(deviceInterface,local_228.m_ptr);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*secondaryCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x206);
  commandBuffer.m_internal =
       local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  info.flags = 1;
  info._20_4_ = 0;
  info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  info._4_4_ = 0;
  info.pNext = (void *)0x0;
  VVar5 = (*deviceInterface->_vptr_DeviceInterface[0x49])
                    (deviceInterface,
                     local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar5,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x75);
  (*deviceInterface->_vptr_DeviceInterface[0x77])
            (deviceInterface,commandBuffer.m_internal,1,&local_228);
  (*deviceInterface->_vptr_DeviceInterface[0x6d])
            (deviceInterface,commandBuffer.m_internal,0x800,0x4000,0,0,0,1,local_c0,0,0);
  VVar5 = (*deviceInterface->_vptr_DeviceInterface[0x4a])(deviceInterface,commandBuffer.m_internal);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*primaryCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x20e);
  submitCommandsAndWait(deviceInterface,local_1b8,queue,(VkCommandBuffer)commandBuffer.m_internal);
  local_1d8 = local_1a8->m_ptr;
  local_1d0 = local_1a8->m_state;
  if (local_1d0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    local_1d0->strongRefCount = local_1d0->strongRefCount + 1;
    UNLOCK();
    LOCK();
    local_1d0->weakRefCount = local_1d0->weakRefCount + 1;
    UNLOCK();
  }
  (*(local_1e0->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.
    super_TestInstance._vptr_TestInstance[5])
            (local_1b0,local_1e0,&local_1d8,bufferSizeBytes,local_198.m_internal);
  if (local_1d0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_1d0->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_1d8 = (Buffer *)0x0;
      (*local_1d0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_1d0->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_1d0 != (SharedPtrStateBase *)0x0) {
        (*local_1d0->_vptr_SharedPtrStateBase[1])();
      }
      local_1d0 = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_198.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)11>_>::operator()(&DStack_190,local_198);
  }
  if ((VkCommandBuffer)local_228.m_ptr != (VkCommandBuffer)0x0) {
    info._0_8_ = local_228.m_ptr;
    (*(local_228.m_state)->_vptr_SharedPtrStateBase[0x48])
              (local_228.m_state,_local_218,pVStack_210,1);
  }
  if ((VkCommandBuffer)
      local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal !=
      (VkCommandBuffer)0x0) {
    info._0_8_ = local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    (*(local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
               ,local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device,
               local_208.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,1
              );
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&pipeline);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector(&shaderModule);
  return local_1b0;
}

Assistant:

tcu::TestStatus ComputeInvocationsSecondaryTestInstance::executeTest (const VkCommandPool&			cmdPool,
																	  const VkPipelineLayout		pipelineLayout,
																	  const VkDescriptorSet&		descriptorSet,
																	  const de::SharedPtr<Buffer>	buffer,
																	  const VkDeviceSize			bufferSizeBytes)
{
	typedef de::SharedPtr<Unique<VkShaderModule> >	VkShaderModuleSp;
	typedef de::SharedPtr<Unique<VkPipeline> >		VkPipelineSp;

	const DeviceInterface&					vk							= m_context.getDeviceInterface();
	const VkDevice							device						= m_context.getDevice();
	const VkQueue							queue						= m_context.getUniversalQueue();

	const VkBufferMemoryBarrier				computeShaderWriteBarrier	=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	const VkBufferMemoryBarrier				computeFinishBarrier		=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	std::vector<VkShaderModuleSp>			shaderModule;
	std::vector<VkPipelineSp>				pipeline;
	for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
	{
		shaderModule.push_back(VkShaderModuleSp(new Unique<VkShaderModule>(createShaderModule(vk, device, m_context.getBinaryCollection().get(m_parameters[parametersNdx].shaderName), (VkShaderModuleCreateFlags)0u))));
		const VkPipelineShaderStageCreateInfo	pipelineShaderStageParams	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			0u,														// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits				stage;
			shaderModule.back().get()->get(),						// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		};

		const VkComputePipelineCreateInfo		pipelineCreateInfo			=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
			DE_NULL,										// const void*						pNext;
			0u,												// VkPipelineCreateFlags			flags;
			pipelineShaderStageParams,						// VkPipelineShaderStageCreateInfo	stage;
			pipelineLayout,									// VkPipelineLayout					layout;
			DE_NULL,										// VkPipeline						basePipelineHandle;
			0,												// deInt32							basePipelineIndex;
		};
		pipeline.push_back(VkPipelineSp(new Unique<VkPipeline>(createComputePipeline(vk, device, DE_NULL , &pipelineCreateInfo))));
	}

	const Unique<VkCommandBuffer>				primaryCmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const Unique<VkCommandBuffer>				secondaryCmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_SECONDARY));

	const Unique<VkQueryPool>					queryPool					(makeQueryPool(vk, device, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT));

	clearBuffer(vk, device, buffer, bufferSizeBytes);
	beginSecondaryCommandBuffer(vk, *secondaryCmdBuffer, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT);
		vk.cmdBindDescriptorSets(*secondaryCmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
		vk.cmdResetQueryPool(*secondaryCmdBuffer, *queryPool, 0u, 1u);
		vk.cmdBeginQuery(*secondaryCmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
		{
				vk.cmdBindPipeline(*secondaryCmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipeline[parametersNdx].get()->get());
				vk.cmdDispatch(*secondaryCmdBuffer, m_parameters[parametersNdx].groupSize.x(), m_parameters[parametersNdx].groupSize.y(), m_parameters[parametersNdx].groupSize.z());

				vk.cmdPipelineBarrier(*secondaryCmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
					(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeShaderWriteBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);
		}
		vk.cmdEndQuery(*secondaryCmdBuffer, *queryPool, 0u);
	VK_CHECK(vk.endCommandBuffer(*secondaryCmdBuffer));

	beginCommandBuffer(vk, *primaryCmdBuffer);
		vk.cmdExecuteCommands(*primaryCmdBuffer, 1u, &secondaryCmdBuffer.get());

		vk.cmdPipelineBarrier(*primaryCmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT,
			(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeFinishBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);

	VK_CHECK(vk.endCommandBuffer(*primaryCmdBuffer));

	// Wait for completion
	submitCommandsAndWait(vk, device, queue, *primaryCmdBuffer);
	return checkResult(buffer, bufferSizeBytes, *queryPool);
}